

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeStructType(Builder *this,Vector<Id> *members,char *name)

{
  pointer puVar1;
  Id IVar2;
  Instruction *this_00;
  int op;
  long lVar3;
  Instruction *type;
  _Head_base<0UL,_spv::Instruction_*,_false> local_30;
  
  this_00 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
  IVar2 = this->uniqueId + 1;
  this->uniqueId = IVar2;
  this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
  this_00->resultId = IVar2;
  this_00->typeId = 0;
  this_00->opCode = OpTypeStruct;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->operands).
  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00->block = (Block *)0x0;
  type = this_00;
  for (lVar3 = 0;
      puVar1 = (members->
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
               _M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)((ulong)((long)(members->
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 2);
      lVar3 = lVar3 + 1) {
    Instruction::addIdOperand(this_00,puVar1[lVar3]);
  }
  std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
            (this->groupedTypes + 0x1e,&type);
  local_30._M_head_impl = type;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&this->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_30);
  if (local_30._M_head_impl != (Instruction *)0x0) {
    (*(local_30._M_head_impl)->_vptr_Instruction[1])();
  }
  Module::mapInstruction(&this->module,type);
  addName(this,type->resultId,name);
  return type->resultId;
}

Assistant:

Id Builder::makeStructType(const dxil_spv::Vector<Id>& members, const char* name)
{
    // Don't look for previous one, because in the general case,
    // structs can be duplicated except for decorations.

    // not found, make it
    Instruction* type = new Instruction(getUniqueId(), NoType, OpTypeStruct);
    for (int op = 0; op < (int)members.size(); ++op)
        type->addIdOperand(members[op]);
    groupedTypes[OpTypeStruct].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);
    addName(type->getResultId(), name);

    return type->getResultId();
}